

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O0

void __thiscall
trompeloeil::list_elem<trompeloeil::sequence_matcher>::invariant_check
          (list_elem<trompeloeil::sequence_matcher> *this)

{
  list_elem<trompeloeil::sequence_matcher> *local_20;
  list_elem<trompeloeil::sequence_matcher> *nn;
  list_elem<trompeloeil::sequence_matcher> *pp;
  list_elem<trompeloeil::sequence_matcher> *this_local;
  
  if (*(list_elem<trompeloeil::sequence_matcher> **)(*(long *)(this + 8) + 0x10) != this) {
    __assert_fail("next->prev == this",
                  "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]scope_guard/test/3rdparty/Trompeloeil/trompeloeil.hpp"
                  ,0x60d,
                  "void trompeloeil::list_elem<trompeloeil::sequence_matcher>::invariant_check() const [T = trompeloeil::sequence_matcher]"
                 );
  }
  if (*(list_elem<trompeloeil::sequence_matcher> **)(*(long *)(this + 0x10) + 8) != this) {
    __assert_fail("prev->next == this",
                  "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]scope_guard/test/3rdparty/Trompeloeil/trompeloeil.hpp"
                  ,0x60e,
                  "void trompeloeil::list_elem<trompeloeil::sequence_matcher>::invariant_check() const [T = trompeloeil::sequence_matcher]"
                 );
  }
  if ((*(list_elem<trompeloeil::sequence_matcher> **)(this + 8) == this) !=
      (*(list_elem<trompeloeil::sequence_matcher> **)(this + 0x10) == this)) {
    __assert_fail("(next == this) == (prev == this)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]scope_guard/test/3rdparty/Trompeloeil/trompeloeil.hpp"
                  ,0x60f,
                  "void trompeloeil::list_elem<trompeloeil::sequence_matcher>::invariant_check() const [T = trompeloeil::sequence_matcher]"
                 );
  }
  if ((*(long *)(*(long *)(this + 0x10) + 8) == *(long *)(this + 8)) !=
      (*(list_elem<trompeloeil::sequence_matcher> **)(this + 8) == this)) {
    __assert_fail("(prev->next == next) == (next == this)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]scope_guard/test/3rdparty/Trompeloeil/trompeloeil.hpp"
                  ,0x610,
                  "void trompeloeil::list_elem<trompeloeil::sequence_matcher>::invariant_check() const [T = trompeloeil::sequence_matcher]"
                 );
  }
  if ((*(long *)(*(long *)(this + 8) + 0x10) == *(long *)(this + 0x10)) !=
      (*(list_elem<trompeloeil::sequence_matcher> **)(this + 0x10) == this)) {
    __assert_fail("(next->prev == prev) == (prev == this)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]scope_guard/test/3rdparty/Trompeloeil/trompeloeil.hpp"
                  ,0x611,
                  "void trompeloeil::list_elem<trompeloeil::sequence_matcher>::invariant_check() const [T = trompeloeil::sequence_matcher]"
                 );
  }
  nn = *(list_elem<trompeloeil::sequence_matcher> **)(this + 0x10);
  local_20 = *(list_elem<trompeloeil::sequence_matcher> **)(this + 8);
  do {
    if ((local_20 == this) != (nn == this)) {
      __assert_fail("(nn == this) == (pp == this)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]scope_guard/test/3rdparty/Trompeloeil/trompeloeil.hpp"
                    ,0x615,
                    "void trompeloeil::list_elem<trompeloeil::sequence_matcher>::invariant_check() const [T = trompeloeil::sequence_matcher]"
                   );
    }
    if (*(list_elem<trompeloeil::sequence_matcher> **)(*(long *)(local_20 + 8) + 0x10) != local_20)
    {
      __assert_fail("nn->next->prev == nn",
                    "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]scope_guard/test/3rdparty/Trompeloeil/trompeloeil.hpp"
                    ,0x616,
                    "void trompeloeil::list_elem<trompeloeil::sequence_matcher>::invariant_check() const [T = trompeloeil::sequence_matcher]"
                   );
    }
    if (*(list_elem<trompeloeil::sequence_matcher> **)(*(long *)(local_20 + 0x10) + 8) != local_20)
    {
      __assert_fail("nn->prev->next == nn",
                    "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]scope_guard/test/3rdparty/Trompeloeil/trompeloeil.hpp"
                    ,0x617,
                    "void trompeloeil::list_elem<trompeloeil::sequence_matcher>::invariant_check() const [T = trompeloeil::sequence_matcher]"
                   );
    }
    if (*(list_elem<trompeloeil::sequence_matcher> **)(*(long *)(nn + 8) + 0x10) != nn) {
      __assert_fail("pp->next->prev == pp",
                    "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]scope_guard/test/3rdparty/Trompeloeil/trompeloeil.hpp"
                    ,0x618,
                    "void trompeloeil::list_elem<trompeloeil::sequence_matcher>::invariant_check() const [T = trompeloeil::sequence_matcher]"
                   );
    }
    if (*(list_elem<trompeloeil::sequence_matcher> **)(*(long *)(nn + 0x10) + 8) != nn) {
      __assert_fail("pp->prev->next == pp",
                    "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]scope_guard/test/3rdparty/Trompeloeil/trompeloeil.hpp"
                    ,0x619,
                    "void trompeloeil::list_elem<trompeloeil::sequence_matcher>::invariant_check() const [T = trompeloeil::sequence_matcher]"
                   );
    }
    if ((*(list_elem<trompeloeil::sequence_matcher> **)(local_20 + 8) == local_20) !=
        (local_20 == this)) {
      __assert_fail("(nn->next == nn) == (nn == this)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]scope_guard/test/3rdparty/Trompeloeil/trompeloeil.hpp"
                    ,0x61a,
                    "void trompeloeil::list_elem<trompeloeil::sequence_matcher>::invariant_check() const [T = trompeloeil::sequence_matcher]"
                   );
    }
    if ((*(list_elem<trompeloeil::sequence_matcher> **)(nn + 0x10) == nn) != (nn == this)) {
      __assert_fail("(pp->prev == pp) == (pp == this)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]scope_guard/test/3rdparty/Trompeloeil/trompeloeil.hpp"
                    ,0x61b,
                    "void trompeloeil::list_elem<trompeloeil::sequence_matcher>::invariant_check() const [T = trompeloeil::sequence_matcher]"
                   );
    }
    local_20 = *(list_elem<trompeloeil::sequence_matcher> **)(local_20 + 8);
    nn = *(list_elem<trompeloeil::sequence_matcher> **)(nn + 0x10);
  } while (local_20 != this);
  return;
}

Assistant:

void
    invariant_check()
    const
    noexcept
    {
#ifdef TROMPELOEIL_SANITY_CHECKS
      TROMPELOEIL_ASSERT(next->prev == this);
      TROMPELOEIL_ASSERT(prev->next == this);
      TROMPELOEIL_ASSERT((next == this) == (prev == this));
      TROMPELOEIL_ASSERT((prev->next == next) == (next == this));
      TROMPELOEIL_ASSERT((next->prev == prev) == (prev == this));
      auto pp = prev;
      auto nn = next;
      do {
        TROMPELOEIL_ASSERT((nn == this) == (pp == this));
        TROMPELOEIL_ASSERT(nn->next->prev == nn);
        TROMPELOEIL_ASSERT(nn->prev->next == nn);
        TROMPELOEIL_ASSERT(pp->next->prev == pp);
        TROMPELOEIL_ASSERT(pp->prev->next == pp);
        TROMPELOEIL_ASSERT((nn->next == nn) == (nn == this));
        TROMPELOEIL_ASSERT((pp->prev == pp) == (pp == this));
        nn = nn->next;
        pp = pp->prev;
      } while (nn != this);
#endif
    }